

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::processPath
               (XMLCh *pathStr,XMLSize_t pathStrLen,bool isSchemePresent,bool bAllowSpaces)

{
  XMLCh XVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (pathStrLen != 0) {
    bVar7 = true;
    if (isSchemePresent) {
      bVar7 = *pathStr == L'/';
    }
    uVar6 = 0;
    do {
      XVar1 = pathStr[uVar6];
      if ((ushort)XVar1 < 0x25) {
        if (XVar1 == L' ') {
          if (!bAllowSpaces) {
            return false;
          }
        }
        else {
          if (XVar1 == L'#') break;
LAB_0025d440:
          bVar3 = XMLString::isAlphaNum(XVar1);
          if ((!bVar3) && (iVar4 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,XVar1), iVar4 == -1))
          {
            if (bVar7) {
              iVar4 = XMLString::indexOf((XMLCh *)PATH_CHARACTERS,XVar1);
              if (iVar4 == -1) {
                return false;
              }
              if (bVar7) goto LAB_0025d49a;
            }
            iVar4 = XMLString::indexOf((XMLCh *)RESERVED_CHARACTERS,XVar1);
            if (iVar4 == -1) {
              return false;
            }
          }
        }
      }
      else {
        if (XVar1 != L'%') {
          if (XVar1 != L'?') goto LAB_0025d440;
          break;
        }
        if (pathStrLen <= uVar6 + 2) {
          return false;
        }
        bVar3 = XMLString::isHex(pathStr[uVar6 + 1]);
        if (!bVar3) {
          return false;
        }
        bVar3 = XMLString::isHex(pathStr[uVar6 + 2]);
        if (!bVar3) {
          return false;
        }
      }
LAB_0025d49a:
      uVar6 = uVar6 + 1;
    } while (pathStrLen + (pathStrLen == 0) != uVar6);
    if ((XVar1 != L'?') && (XVar1 != L'#')) {
      return true;
    }
    if (pathStrLen <= uVar6 + 1) {
      return true;
    }
    bVar7 = XVar1 == L'?';
    uVar2 = uVar6 + 1;
    do {
      uVar5 = uVar2;
      XVar1 = pathStr[uVar5];
      if (XVar1 == L' ') {
        if (!bAllowSpaces) {
          return false;
        }
      }
      else if (XVar1 == L'%') {
        if (pathStrLen <= uVar6 + 3) {
          return false;
        }
        bVar3 = XMLString::isHex(pathStr[uVar6 + 2]);
        if (!bVar3) {
          return false;
        }
        bVar3 = XMLString::isHex(pathStr[uVar6 + 3]);
        if (!bVar3) {
          return false;
        }
      }
      else if ((XVar1 == L'#') && (bVar7)) {
        bVar7 = false;
      }
      else {
        bVar3 = XMLString::isAlphaNum(XVar1);
        if ((!bVar3) &&
           (iVar4 = XMLString::indexOf((XMLCh *)MARK_OR_RESERVED_CHARACTERS,XVar1), iVar4 == -1)) {
          return false;
        }
      }
      uVar2 = uVar5 + 1;
      uVar6 = uVar5;
    } while (uVar5 + 1 < pathStrLen);
  }
  return true;
}

Assistant:

bool XMLUri::processPath(const XMLCh* const pathStr,
                         const XMLSize_t pathStrLen,
                         const bool isSchemePresent,
                         const bool bAllowSpaces/*=false*/)
{
    if (pathStrLen != 0)
    {
        XMLSize_t index = 0;
        XMLCh testChar = chNull;
        bool isOpaque = (!isSchemePresent || *pathStr == chForwardSlash);

        // path - everything up to query string or fragment
        //
        // RFC 2732 only allows '[' and ']' to appear in the opaque part.
        while (index < pathStrLen)
        {
            testChar = pathStr[index];
            if (testChar == chQuestion || testChar == chPound)
                break;

            if (testChar == chPercent)
            {
                if (index+2 >= pathStrLen ||
                    !XMLString::isHex(pathStr[index+1]) ||
                    !XMLString::isHex(pathStr[index+2]))
                        return false;
            }
            else if (testChar==chSpace)
            {
                if(!bAllowSpaces)
                    return false;
            }
            else if (!isUnreservedCharacter(testChar) &&
                     ((isOpaque && !isPathCharacter(testChar)) ||
                      (!isOpaque && !isReservedCharacter(testChar))))
            {
                return false;
            }

            index++;
        }

        // query - starts with ? and up to fragment or end
        // fragment - starts with #
        bool isQuery = (testChar == chQuestion);
        if (isQuery || testChar == chPound)
        {
            index++;
            while (index < pathStrLen)
            {
                testChar = pathStr[index];
                if (testChar == chPound && isQuery) {
                    isQuery = false;
                    index++;
                    continue;
                }

                if (testChar == chPercent)
                {
                    if (index+2 >= pathStrLen ||
                        !XMLString::isHex(pathStr[index+1]) ||
                        !XMLString::isHex(pathStr[index+2]))
                        return false;
                }
                else if (testChar==chSpace)
                {
                    if(!bAllowSpaces)
                        return false;
                }
                else if (!isReservedOrUnreservedCharacter(testChar))
                {
                    return false;
                }
                index++;
            }
        }
    } //if (pathStrLen...)

    return true;
}